

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::ServiceOptions::_InternalParse(ServiceOptions *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  bool bVar5;
  UninterpretedOption *obj;
  MessageLite *msg;
  char *pcVar6;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  UnknownFieldSet *unknown;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  byte *local_50;
  InternalMetadata *local_48;
  ExtensionSet *local_40;
  long local_38;
  byte *pbVar7;
  
  local_50 = (byte *)ptr;
  bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  uVar12 = 0;
  if (!bVar5) {
    local_48 = &(this->super_Message).super_MessageLite._internal_metadata_;
    local_40 = &this->_extensions_;
    uVar12 = 0;
    local_38 = 9;
    do {
      bVar1 = *local_50;
      pVar13.second._0_1_ = bVar1;
      pVar13.first = (char *)(local_50 + 1);
      pVar13._9_7_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = local_50[1];
        uVar10 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar13 = internal::ReadTagFallback((char *)local_50,uVar10);
        }
        else {
          pVar13.second = uVar10;
          pVar13.first = (char *)(local_50 + 2);
          pVar13._12_4_ = 0;
        }
      }
      local_50 = (byte *)pVar13.first;
      uVar11 = pVar13.second;
      uVar8 = (uint)(pVar13._8_8_ >> 3) & 0x1fffffff;
      if (uVar8 == 999) {
        if ((char)pVar13.second == ':') {
          local_50 = local_50 + -2;
          goto LAB_0038209c;
        }
LAB_0038210b:
        if (uVar11 == 0 || (uVar11 & 7) == 4) {
          if (local_50 != (byte *)0x0) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
            pcVar6 = (char *)(*(code *)(&DAT_00442624 + *(int *)(&DAT_00442624 + local_38 * 4)))();
            return pcVar6;
          }
          goto LAB_00382244;
        }
        uVar9 = pVar13._8_8_ & 0xffffffff;
        if (uVar11 < 8000) {
          if ((local_48->ptr_ & 1U) == 0) {
            unknown = internal::InternalMetadata::
                      mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_48);
          }
          else {
            unknown = (UnknownFieldSet *)((local_48->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_50 = (byte *)internal::UnknownFieldParse(uVar9,unknown,(char *)local_50,ctx);
          uVar9 = (ulong)((uint)(local_50 == (byte *)0x0) * 5);
          goto LAB_00382210;
        }
        local_50 = (byte *)internal::ExtensionSet::ParseField
                                     (local_40,uVar9,(char *)local_50,
                                      (Message *)_ServiceOptions_default_instance_,local_48,ctx);
        switch(local_50 == (byte *)0x0) {
        case true:
          goto switchD_0038208c_caseD_1;
        }
      }
      else {
        if ((uVar8 != 0x21) || ((char)pVar13.second != '\b')) goto LAB_0038210b;
        bVar1 = *local_50;
        pVar14.second = (long)(char)bVar1;
        pVar14.first = (char *)local_50;
        pbVar7 = local_50 + 1;
        if (-1 < (long)(char)bVar1) {
LAB_00382066:
          this->deprecated_ = pVar14.second != 0;
          uVar12 = 1;
          local_50 = pbVar7;
          switch(pbVar7 == (byte *)0x0) {
          case false:
            goto switchD_0038208c_caseD_0;
          }
switchD_0038208c_caseD_1:
          local_50 = (byte *)0x0;
          break;
        }
        uVar10 = ((uint)*pbVar7 * 0x80 + (uint)bVar1) - 0x80;
        if ((char)*pbVar7 < '\0') {
          pVar14 = internal::VarintParseSlow64((char *)local_50,uVar10);
          pbVar7 = (byte *)pVar14.first;
          goto LAB_00382066;
        }
        local_50 = local_50 + 2;
        this->deprecated_ = uVar10 != 0;
        uVar12 = 1;
        switch(local_50 == (byte *)0x0) {
        case true:
          goto switchD_0038208c_caseD_1;
        }
      }
switchD_0038208c_caseD_0:
      bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    } while (!bVar5);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar12;
  return (char *)local_50;
LAB_00382244:
  uVar9 = 5;
  goto LAB_00382210;
  while ((uVar9 = 2, local_50 < (ctx->super_EpsCopyInputStream).limit_end_ &&
         (*(short *)local_50 == 0x3eba))) {
LAB_0038209c:
    local_50 = local_50 + 2;
    pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4 == (Rep *)0x0) {
LAB_003820c0:
      obj = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                      ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
      msg = (MessageLite *)
            internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,obj);
    }
    else {
      iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar4->allocated_size <= iVar3) goto LAB_003820c0;
      (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
      msg = (MessageLite *)pRVar4->elements[iVar3];
    }
    local_50 = (byte *)internal::ParseContext::ParseMessage(ctx,msg,(char *)local_50);
    if (local_50 == (byte *)0x0) goto LAB_00382244;
  }
LAB_00382210:
  pcVar6 = (char *)(*(code *)(&DAT_00442624 + *(int *)(&DAT_00442624 + uVar9 * 4)))();
  return pcVar6;
}

Assistant:

const char* ServiceOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    if ((8000u <= tag)) {
      ptr = _extensions_.ParseField(tag, ptr, internal_default_instance(), &_internal_metadata_, ctx);
      CHK_(ptr != nullptr);
      continue;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}